

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_ersatz_socketpair_(int family,int type,int protocol,int *fd)

{
  bool bVar1;
  int __fd;
  int iVar2;
  int __fd_00;
  int iVar3;
  int __fd_01;
  int *piVar4;
  socklen_t size;
  sockaddr_in connect_addr;
  sockaddr_in listen_addr;
  socklen_t local_5c;
  sockaddr local_58;
  sockaddr local_48;
  
  if (family - 3U < 0xfffffffe || protocol != 0) {
    piVar4 = __errno_location();
    *piVar4 = 0x61;
    return -1;
  }
  if (fd == (int *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return -1;
  }
  __fd = socket(2,type,0);
  if (__fd < 0) {
    return -1;
  }
  local_48.sa_data[6] = '\0';
  local_48.sa_data[7] = '\0';
  local_48.sa_data[8] = '\0';
  local_48.sa_data[9] = '\0';
  local_48.sa_data[10] = '\0';
  local_48.sa_data[0xb] = '\0';
  local_48.sa_data[0xc] = '\0';
  local_48.sa_data[0xd] = '\0';
  local_48.sa_family = 2;
  local_48.sa_data[0] = '\0';
  local_48.sa_data[1] = '\0';
  local_48.sa_data[2] = '\x7f';
  local_48.sa_data[3] = '\0';
  local_48.sa_data[4] = '\0';
  local_48.sa_data[5] = '\x01';
  iVar2 = bind(__fd,&local_48,0x10);
  __fd_01 = -1;
  bVar1 = true;
  if ((iVar2 == -1) || (iVar2 = listen(__fd,1), iVar2 == -1)) {
    iVar2 = -1;
    __fd_00 = -1;
    goto LAB_00235cdc;
  }
  __fd_00 = socket(2,type,0);
  if (-1 < __fd_00) {
    local_58.sa_family = 0;
    local_58.sa_data[0] = '\0';
    local_58.sa_data[1] = '\0';
    local_58.sa_data[2] = '\0';
    local_58.sa_data[3] = '\0';
    local_58.sa_data[4] = '\0';
    local_58.sa_data[5] = '\0';
    local_58.sa_data[6] = '\0';
    local_58.sa_data[7] = '\0';
    local_58.sa_data[8] = '\0';
    local_58.sa_data[9] = '\0';
    local_58.sa_data[10] = '\0';
    local_58.sa_data[0xb] = '\0';
    local_58.sa_data[0xc] = '\0';
    local_58.sa_data[0xd] = '\0';
    local_5c = 0x10;
    iVar2 = getsockname(__fd,&local_58,&local_5c);
    if (iVar2 != -1) {
      iVar2 = 0x67;
      if (local_5c != 0x10) goto LAB_00235cd9;
      iVar3 = connect(__fd_00,&local_58,0x10);
      if (iVar3 != -1) {
        local_5c = 0x10;
        __fd_01 = accept(__fd,&local_48,&local_5c);
        if (-1 < __fd_01) {
          if (local_5c == 0x10) {
            iVar3 = getsockname(__fd_00,&local_58,&local_5c);
            if (iVar3 == -1) goto LAB_00235cd1;
            if (local_5c == 0x10) {
              if (local_48.sa_family == local_58.sa_family) {
                if (local_48.sa_data._2_4_ == local_58.sa_data._2_4_) {
                  bVar1 = false;
                  if (local_48.sa_data._0_2_ == local_58.sa_data._0_2_) {
                    close(__fd);
                    *fd = __fd_00;
                    fd[1] = __fd_01;
                    return 0;
                  }
                  goto LAB_00235cdc;
                }
              }
            }
          }
LAB_00235cd9:
          bVar1 = false;
          goto LAB_00235cdc;
        }
      }
    }
  }
LAB_00235cd1:
  iVar2 = -1;
LAB_00235cdc:
  if (bVar1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
  }
  close(__fd);
  if (__fd_00 != -1) {
    close(__fd_00);
  }
  if (__fd_01 != -1) {
    close(__fd_01);
  }
  piVar4 = __errno_location();
  *piVar4 = iVar2;
  return -1;
}

Assistant:

int
evutil_ersatz_socketpair_(int family, int type, int protocol,
    evutil_socket_t fd[2])
{
	/* This code is originally from Tor.  Used with permission. */

	/* This socketpair does not work when localhost is down. So
	 * it's really not the same thing at all. But it's close enough
	 * for now, and really, when localhost is down sometimes, we
	 * have other problems too.
	 */
#ifdef _WIN32
#define ERR(e) WSA##e
#else
#define ERR(e) e
#endif
	evutil_socket_t listener = -1;
	evutil_socket_t connector = -1;
	evutil_socket_t acceptor = -1;
	struct sockaddr_in listen_addr;
	struct sockaddr_in connect_addr;
	ev_socklen_t size;
	int saved_errno = -1;
	int family_test;
	
	family_test = family != AF_INET;
#ifdef AF_UNIX
	family_test = family_test && (family != AF_UNIX);
#endif
	if (protocol || family_test) {
		EVUTIL_SET_SOCKET_ERROR(ERR(EAFNOSUPPORT));
		return -1;
	}
	
	if (!fd) {
		EVUTIL_SET_SOCKET_ERROR(ERR(EINVAL));
		return -1;
	}

	listener = socket(AF_INET, type, 0);
	if (listener < 0)
		return -1;
	memset(&listen_addr, 0, sizeof(listen_addr));
	listen_addr.sin_family = AF_INET;
	listen_addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	listen_addr.sin_port = 0;	/* kernel chooses port.	 */
	if (bind(listener, (struct sockaddr *) &listen_addr, sizeof (listen_addr))
		== -1)
		goto tidy_up_and_fail;
	if (listen(listener, 1) == -1)
		goto tidy_up_and_fail;

	connector = socket(AF_INET, type, 0);
	if (connector < 0)
		goto tidy_up_and_fail;

	memset(&connect_addr, 0, sizeof(connect_addr));

	/* We want to find out the port number to connect to.  */
	size = sizeof(connect_addr);
	if (getsockname(listener, (struct sockaddr *) &connect_addr, &size) == -1)
		goto tidy_up_and_fail;
	if (size != sizeof (connect_addr))
		goto abort_tidy_up_and_fail;
	if (connect(connector, (struct sockaddr *) &connect_addr,
				sizeof(connect_addr)) == -1)
		goto tidy_up_and_fail;

	size = sizeof(listen_addr);
	acceptor = accept(listener, (struct sockaddr *) &listen_addr, &size);
	if (acceptor < 0)
		goto tidy_up_and_fail;
	if (size != sizeof(listen_addr))
		goto abort_tidy_up_and_fail;
	/* Now check we are talking to ourself by matching port and host on the
	   two sockets.	 */
	if (getsockname(connector, (struct sockaddr *) &connect_addr, &size) == -1)
		goto tidy_up_and_fail;
	if (size != sizeof (connect_addr)
		|| listen_addr.sin_family != connect_addr.sin_family
		|| listen_addr.sin_addr.s_addr != connect_addr.sin_addr.s_addr
		|| listen_addr.sin_port != connect_addr.sin_port)
		goto abort_tidy_up_and_fail;
	evutil_closesocket(listener);
	fd[0] = connector;
	fd[1] = acceptor;

	return 0;

 abort_tidy_up_and_fail:
	saved_errno = ERR(ECONNABORTED);
 tidy_up_and_fail:
	if (saved_errno < 0)
		saved_errno = EVUTIL_SOCKET_ERROR();
	if (listener != -1)
		evutil_closesocket(listener);
	if (connector != -1)
		evutil_closesocket(connector);
	if (acceptor != -1)
		evutil_closesocket(acceptor);

	EVUTIL_SET_SOCKET_ERROR(saved_errno);
	return -1;
#undef ERR
}